

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
CustomUintFormatter<8,false>::Unser<DataStream,ServiceFlags>
          (CustomUintFormatter<8,_false> *this,DataStream *s,ServiceFlags *v)

{
  long lVar1;
  Span<unsigned_long> s_00;
  uint64_t uVar2;
  size_t in_RCX;
  uint64_t *in_RDX;
  DataStream *in_RSI;
  long in_FS_OFFSET;
  Span<std::byte> SVar3;
  uint64_t raw;
  uint64_t in_stack_ffffffffffffff98;
  Span<std::byte> *in_stack_ffffffffffffffa8;
  unsigned_long *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Span<unsigned_long>::Span<unsigned_long,_0>
            ((Span<unsigned_long> *)in_stack_ffffffffffffffa8,(unsigned_long *)in_RSI,
             in_stack_ffffffffffffff98);
  s_00.m_size = (size_t)in_RDX;
  s_00.m_data = in_stack_ffffffffffffffb0;
  AsWritableBytes<unsigned_long>(s_00);
  SVar3 = Span<std::byte>::first(in_stack_ffffffffffffffa8,(size_t)in_RSI);
  DataStream::read(in_RSI,(int)SVar3.m_data,(void *)SVar3.m_size,in_RCX);
  uVar2 = le64toh_internal(in_stack_ffffffffffffff98);
  *in_RDX = uVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, I& v)
    {
        using U = typename std::conditional<std::is_enum<I>::value, std::underlying_type<I>, std::common_type<I>>::type::type;
        static_assert(std::numeric_limits<U>::max() >= MAX && std::numeric_limits<U>::min() <= 0, "Assigned type too small");
        uint64_t raw = 0;
        if (BigEndian) {
            s.read(AsWritableBytes(Span{&raw, 1}).last(Bytes));
            v = static_cast<I>(be64toh_internal(raw));
        } else {
            s.read(AsWritableBytes(Span{&raw, 1}).first(Bytes));
            v = static_cast<I>(le64toh_internal(raw));
        }
    }